

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_os_stat(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int is_lstat)

{
  int iVar1;
  char *__file;
  int *piVar2;
  ulong uVar3;
  int64_t iVar4;
  JSValueUnion JVar5;
  int64_t iVar6;
  int64_t iVar7;
  ulong uVar8;
  bool bVar9;
  JSValue JVar10;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue val_03;
  JSValue val_04;
  JSValue val_05;
  JSValue val_06;
  JSValue val_07;
  JSValue val_08;
  JSValue val_09;
  stat st;
  
  __file = JS_ToCString(ctx,*argv);
  iVar4 = 6;
  if (__file == (char *)0x0) {
LAB_00110f72:
    uVar8 = 0;
    uVar3 = 0;
  }
  else {
    if (is_lstat == 0) {
      iVar1 = stat(__file,(stat *)&st);
    }
    else {
      iVar1 = lstat(__file,(stat *)&st);
    }
    JS_FreeCString(ctx,__file);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      JVar10 = (JSValue)(ZEXT816(2) << 0x40);
    }
    else {
      JVar10 = JS_NewObject(ctx);
      iVar7 = 0;
      iVar1 = 0;
      if ((int)JVar10.tag == 6) goto LAB_00110f72;
      bVar9 = (long)(int)st.st_dev == st.st_dev;
      JVar5.float64 = (double)(long)st.st_dev;
      if (bVar9) {
        JVar5.ptr = (void *)(st.st_dev & 0xffffffff);
      }
      iVar4 = 7;
      iVar6 = iVar4;
      if (bVar9) {
        iVar6 = iVar7;
      }
      val.tag = iVar6;
      val.u.float64 = JVar5.float64;
      JS_DefinePropertyValueStr(ctx,JVar10,"dev",val,7);
      iVar6 = iVar4;
      JVar5.float64 = (double)(long)st.st_ino;
      if ((long)(int)st.st_ino == st.st_ino) {
        iVar6 = iVar7;
        JVar5.ptr = (void *)(st.st_ino & 0xffffffff);
      }
      val_00.tag = iVar6;
      val_00.u.float64 = JVar5.float64;
      JS_DefinePropertyValueStr(ctx,JVar10,"ino",val_00,7);
      JS_DefinePropertyValueStr(ctx,JVar10,"mode",(JSValue)ZEXT416(st.st_mode),7);
      iVar6 = iVar4;
      JVar5.float64 = (double)(long)st.st_nlink;
      if ((long)(int)st.st_nlink == st.st_nlink) {
        iVar6 = iVar7;
        JVar5.ptr = (void *)(st.st_nlink & 0xffffffff);
      }
      val_01.tag = iVar6;
      val_01.u.float64 = JVar5.float64;
      JS_DefinePropertyValueStr(ctx,JVar10,"nlink",val_01,7);
      iVar6 = iVar4;
      JVar5.float64 = (double)st.st_uid;
      if (-1 < (long)(int)st.st_uid) {
        iVar6 = iVar7;
        JVar5 = (JSValueUnion)(long)(int)st.st_uid;
      }
      val_02.tag = iVar6;
      val_02.u.float64 = JVar5.float64;
      JS_DefinePropertyValueStr(ctx,JVar10,"uid",val_02,7);
      iVar6 = iVar4;
      JVar5.float64 = (double)st.st_gid;
      if (-1 < (long)(int)st.st_gid) {
        iVar6 = iVar7;
        JVar5 = (JSValueUnion)(long)(int)st.st_gid;
      }
      val_03.tag = iVar6;
      val_03.u.float64 = JVar5.float64;
      JS_DefinePropertyValueStr(ctx,JVar10,"gid",val_03,7);
      iVar6 = iVar4;
      JVar5.float64 = (double)(long)st.st_rdev;
      if ((long)(int)st.st_rdev == st.st_rdev) {
        iVar6 = iVar7;
        JVar5.ptr = (void *)(st.st_rdev & 0xffffffff);
      }
      val_04.tag = iVar6;
      val_04.u.float64 = JVar5.float64;
      JS_DefinePropertyValueStr(ctx,JVar10,"rdev",val_04,7);
      iVar6 = iVar4;
      JVar5.float64 = (double)st.st_size;
      if ((int)st.st_size == st.st_size) {
        iVar6 = iVar7;
        JVar5.ptr = (void *)(st.st_size & 0xffffffff);
      }
      val_05.tag = iVar6;
      val_05.u.float64 = JVar5.float64;
      JS_DefinePropertyValueStr(ctx,JVar10,"size",val_05,7);
      iVar6 = iVar4;
      JVar5.float64 = (double)st.st_blocks;
      if ((int)st.st_blocks == st.st_blocks) {
        iVar6 = iVar7;
        JVar5.ptr = (void *)(st.st_blocks & 0xffffffff);
      }
      val_06.tag = iVar6;
      val_06.u.float64 = JVar5.float64;
      JS_DefinePropertyValueStr(ctx,JVar10,"blocks",val_06,7);
      uVar3 = st.st_atim.tv_nsec / 1000000 + st.st_atim.tv_sec * 1000;
      iVar6 = iVar4;
      JVar5.float64 = (double)(long)uVar3;
      if ((long)(int)uVar3 == uVar3) {
        iVar6 = iVar7;
        JVar5.ptr = (void *)(uVar3 & 0xffffffff);
      }
      val_07.tag = iVar6;
      val_07.u.float64 = JVar5.float64;
      JS_DefinePropertyValueStr(ctx,JVar10,"atime",val_07,7);
      uVar3 = st.st_mtim.tv_nsec / 1000000 + st.st_mtim.tv_sec * 1000;
      iVar6 = iVar4;
      JVar5.float64 = (double)(long)uVar3;
      if ((long)(int)uVar3 == uVar3) {
        iVar6 = iVar7;
        JVar5.ptr = (void *)(uVar3 & 0xffffffff);
      }
      val_08.tag = iVar6;
      val_08.u.float64 = JVar5.float64;
      JS_DefinePropertyValueStr(ctx,JVar10,"mtime",val_08,7);
      uVar3 = st.st_ctim.tv_nsec / 1000000 + st.st_ctim.tv_sec * 1000;
      JVar5.float64 = (double)(long)uVar3;
      if ((long)(int)uVar3 == uVar3) {
        iVar4 = iVar7;
        JVar5.ptr = (void *)(uVar3 & 0xffffffff);
      }
      val_09.tag = iVar4;
      val_09.u.float64 = JVar5.float64;
      JS_DefinePropertyValueStr(ctx,JVar10,"ctime",val_09,7);
    }
    JVar10 = make_obj_error(ctx,JVar10,iVar1);
    iVar4 = JVar10.tag;
    uVar3 = (ulong)JVar10.u.ptr & 0xffffffff00000000;
    uVar8 = (ulong)JVar10.u._0_4_;
  }
  JVar10.tag = iVar4;
  JVar10.u.ptr = (void *)(uVar8 | uVar3);
  return JVar10;
}

Assistant:

static JSValue js_os_stat(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv, int is_lstat)
{
    const char *path;
    int err, res;
    struct stat st;
    JSValue obj;

    path = JS_ToCString(ctx, argv[0]);
    if (!path)
        return JS_EXCEPTION;
#if defined(_WIN32)
    res = stat(path, &st);
#else
    if (is_lstat)
        res = lstat(path, &st);
    else
        res = stat(path, &st);
#endif
    JS_FreeCString(ctx, path);
    if (res < 0) {
        err = errno;
        obj = JS_NULL;
    } else {
        err = 0;
        obj = JS_NewObject(ctx);
        if (JS_IsException(obj))
            return JS_EXCEPTION;
        JS_DefinePropertyValueStr(ctx, obj, "dev",
                                  JS_NewInt64(ctx, st.st_dev),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "ino",
                                  JS_NewInt64(ctx, st.st_ino),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "mode",
                                  JS_NewInt32(ctx, st.st_mode),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "nlink",
                                  JS_NewInt64(ctx, st.st_nlink),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "uid",
                                  JS_NewInt64(ctx, st.st_uid),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "gid",
                                  JS_NewInt64(ctx, st.st_gid),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "rdev",
                                  JS_NewInt64(ctx, st.st_rdev),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "size",
                                  JS_NewInt64(ctx, st.st_size),
                                  JS_PROP_C_W_E);
#if !defined(_WIN32)
        JS_DefinePropertyValueStr(ctx, obj, "blocks",
                                  JS_NewInt64(ctx, st.st_blocks),
                                  JS_PROP_C_W_E);
#endif
#if defined(_WIN32)
        JS_DefinePropertyValueStr(ctx, obj, "atime",
                                  JS_NewInt64(ctx, (int64_t)st.st_atime * 1000),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "mtime",
                                  JS_NewInt64(ctx, (int64_t)st.st_mtime * 1000),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "ctime",
                                  JS_NewInt64(ctx, (int64_t)st.st_ctime * 1000),
                                  JS_PROP_C_W_E);
#elif defined(__APPLE__)
        JS_DefinePropertyValueStr(ctx, obj, "atime",
                                  JS_NewInt64(ctx, timespec_to_ms(&st.st_atimespec)),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "mtime",
                                  JS_NewInt64(ctx, timespec_to_ms(&st.st_mtimespec)),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "ctime",
                                  JS_NewInt64(ctx, timespec_to_ms(&st.st_ctimespec)),
                                  JS_PROP_C_W_E);
#else
        JS_DefinePropertyValueStr(ctx, obj, "atime",
                                  JS_NewInt64(ctx, timespec_to_ms(&st.st_atim)),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "mtime",
                                  JS_NewInt64(ctx, timespec_to_ms(&st.st_mtim)),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "ctime",
                                  JS_NewInt64(ctx, timespec_to_ms(&st.st_ctim)),
                                  JS_PROP_C_W_E);
#endif
    }
    return make_obj_error(ctx, obj, err);
}